

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

Vector2f __thiscall Rml::Element::GetRelativeOffset(Element *this,BoxArea area)

{
  Box *this_00;
  Vector2f VVar1;
  Vector2<float> VVar2;
  Vector2<float> local_24;
  BoxArea local_1c;
  Element *pEStack_18;
  BoxArea area_local;
  Element *this_local;
  
  VVar2.x = (this->relative_offset_position).x;
  VVar2.y = (this->relative_offset_position).y;
  local_1c = area;
  pEStack_18 = this;
  local_24 = Vector2<float>::operator+(&this->relative_offset_base,VVar2);
  this_00 = GetBox(this);
  VVar1 = Box::GetPosition(this_00,local_1c);
  VVar2 = Vector2<float>::operator+(&local_24,VVar1);
  VVar1.x = VVar2.x;
  VVar1.y = VVar2.y;
  return VVar1;
}

Assistant:

Vector2f Element::GetRelativeOffset(BoxArea area)
{
	return relative_offset_base + relative_offset_position + GetBox().GetPosition(area);
}